

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

Vec_Bit_t * Gia_ManFindComplLuts(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  byte bVar6;
  Vec_Bit_t *pVVar7;
  int *__s;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  size_t __size;
  int iVar12;
  int iVar13;
  
  uVar2 = pGia->nObjs;
  iVar13 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  pVVar7 = (Vec_Bit_t *)malloc(0x10);
  iVar12 = iVar13 * 0x20;
  pVVar7->nCap = iVar12;
  if (iVar13 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar13 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar12;
  memset(__s,0,__size);
  pVVar4 = pGia->vCos;
  iVar13 = pVVar4->nSize;
  if (0 < iVar13) {
    piVar5 = pVVar4->pArray;
    lVar9 = 0;
    while( true ) {
      iVar3 = piVar5[lVar9];
      if (((long)iVar3 < 0) || ((int)uVar2 <= iVar3)) goto LAB_0074caff;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGia->pObjs + iVar3;
      uVar10 = (uint)*(undefined8 *)pGVar1;
      uVar8 = *(uint *)(pGVar1 + -(ulong)(uVar10 & 0x1fffffff));
      if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) && ((uVar10 >> 0x1d & 1) != 0)) {
        uVar8 = iVar3 - (uVar10 & 0x1fffffff);
        if (((int)uVar8 < 0) || (iVar12 <= (int)uVar8)) goto LAB_0074cb1e;
        __s[uVar8 >> 5] = __s[uVar8 >> 5] | 1 << ((byte)uVar8 & 0x1f);
        iVar13 = pVVar4->nSize;
      }
      lVar9 = lVar9 + 1;
      if (iVar13 <= lVar9) break;
    }
    if (0 < iVar13) {
      piVar5 = pVVar4->pArray;
      lVar9 = 0;
      do {
        uVar8 = piVar5[lVar9];
        if (((long)(int)uVar8 < 0) || (uVar2 <= uVar8)) {
LAB_0074caff:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGia->pObjs == (Gia_Obj_t *)0x0) {
          return pVVar7;
        }
        pGVar1 = pGia->pObjs + (int)uVar8;
        uVar11 = (uint)*(undefined8 *)pGVar1;
        uVar10 = *(uint *)(pGVar1 + -(ulong)(uVar11 & 0x1fffffff));
        if (((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) && ((uVar11 >> 0x1d & 1) == 0)) {
          uVar8 = uVar8 - (uVar11 & 0x1fffffff);
          if (((int)uVar8 < 0) || (iVar12 <= (int)uVar8)) {
LAB_0074cb1e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          bVar6 = (byte)uVar8 & 0x1f;
          __s[uVar8 >> 5] = __s[uVar8 >> 5] & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          iVar13 = pVVar4->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar13);
    }
  }
  return pVVar7;
}

Assistant:

Vec_Bit_t * Gia_ManFindComplLuts( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;  int i;
    // mark objects pointed by COs in negative polarity
    Vec_Bit_t * vMarks = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 1 );
    // unmark objects pointed by COs in positive polarity
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && !Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 0 );
    return vMarks;
}